

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# values.h
# Opt level: O1

content<unsigned_short> * __thiscall
mpt::value_store::reserve<unsigned_short>(value_store *this,long count)

{
  content<unsigned_short> *pcVar1;
  
  if ((reserve<unsigned_short>::traits == (type_traits *)0x0) &&
     (reserve<unsigned_short>::traits = (type_traits *)mpt::type_traits::get(0x71),
     reserve<unsigned_short>::traits == (type_traits *)0x0)) {
    return (content<unsigned_short> *)0x0;
  }
  pcVar1 = (content<unsigned_short> *)mpt::value_store::reserve((long)this,(type_traits *)count);
  if (pcVar1 != (content<unsigned_short> *)0x0) {
    this->_type = 0x71;
  }
  return pcVar1;
}

Assistant:

content<T> *reserve(long count = 0)
	{
		static const struct type_traits *traits = 0;
		if (!traits && !(traits = type_properties<T>::traits())) {
			return 0;
		}
		buffer *buf = reserve(count, *traits);
		if (buf) {
			/* type ID registration may take place during runtime */
			int type = type_properties<T>::id(false);
			_type = (type > 0) ? type : 0;
		}
		return static_cast<content<T>*>(buf);
	}